

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageLoadStoreTests.cpp
# Opt level: O0

string * __thiscall
gl4cts::(anonymous_namespace)::BasicAllFormatsStoreGeometryStages::
GenGS<tcu::Vector<unsigned_int,4>>
          (string *__return_storage_ptr__,BasicAllFormatsStoreGeometryStages *this,
          GLenum internalformat,Vector<unsigned_int,_4> *value)

{
  ostream *poVar1;
  string local_210;
  string local_1f0;
  string local_1d0;
  ostringstream local_1a0 [8];
  ostringstream os;
  Vector<unsigned_int,_4> *value_local;
  GLenum internalformat_local;
  BasicAllFormatsStoreGeometryStages *this_local;
  
  os._368_8_ = value;
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  poVar1 = std::operator<<((ostream *)local_1a0,
                           "#version 420 core\nlayout(points) in;\nlayout(points, max_vertices = 1) out;\nlayout("
                          );
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_1d0,(ShaderImageLoadStoreBase *)this,internalformat);
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  poVar1 = std::operator<<(poVar1,") writeonly uniform ");
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_1f0,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_1f0);
  poVar1 = std::operator<<(poVar1,
                           "image2DArray g_image3;\nvoid main() {\n  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);\n  imageStore(g_image3, coord, "
                          );
  ShaderImageLoadStoreBase::TypePrefix<tcu::Vector<unsigned_int,4>>
            (&local_210,(ShaderImageLoadStoreBase *)this);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  poVar1 = std::operator<<(poVar1,"vec4");
  poVar1 = tcu::operator<<(poVar1,(Vector<unsigned_int,_4> *)os._368_8_);
  std::operator<<(poVar1,");\n}");
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string GenGS(GLenum internalformat, const T& value)
	{
		std::ostringstream os;
		os << "#version 420 core" NL "layout(points) in;" NL "layout(points, max_vertices = 1) out;" NL "layout("
		   << FormatEnumToString(internalformat) << ") writeonly uniform " << TypePrefix<T>()
		   << "image2DArray g_image3;" NL "void main() {" NL "  ivec3 coord = ivec3(gl_PrimitiveIDIn, 0, 0);" NL
			  "  imageStore(g_image3, coord, "
		   << TypePrefix<T>() << "vec4" << value << ");" NL "}";
		return os.str();
	}